

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O3

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *p,Mio_Library_t *pMio)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  Mmr_Step_t *pMVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *vCopy;
  Vec_Int_t *__ptr_00;
  Abc_Ntk_t *pNtk;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Mig_Man_t *pMVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  int *local_98;
  
  __ptr = Mpm_ManFindCells(pMio,(SC_Lib *)p->pPars->pScl,p->vNpnConfigs);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    puts("Genlib library does not match SCL library.");
    return (Abc_Ntk_t *)0x0;
  }
  iVar1 = p->pMig->nObjs;
  iVar7 = iVar1 * 2;
  vCopy = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar8 = iVar7;
  }
  vCopy->nCap = iVar8;
  if (iVar8 == 0) {
    vCopy->pArray = (int *)0x0;
    vCopy->nSize = iVar7;
  }
  else {
    local_98 = (int *)malloc((long)iVar8 << 2);
    vCopy->pArray = local_98;
    vCopy->nSize = iVar7;
    if (local_98 != (int *)0x0) {
      memset(local_98,0xff,(long)iVar1 << 3);
      goto LAB_0047b336;
    }
  }
  local_98 = (int *)0x0;
LAB_0047b336:
  __ptr_00 = Mpm_ManFindMappedNodes(p);
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_MAP,1);
  pcVar10 = Extra_UtilStrsav(p->pMig->pName);
  pNtk->pName = pcVar10;
  pNtk->pManFunc = pMio;
  pMVar13 = p->pMig;
  uVar15 = (pMVar13->vCis).nSize;
  uVar16 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    lVar18 = 0;
    do {
      if ((int)uVar16 <= lVar18) goto LAB_0047b8f7;
      uVar15 = (pMVar13->vCis).pArray[lVar18];
      if (((int)uVar15 < 0) || (pMVar13->nObjs <= (int)uVar15)) goto LAB_0047b8b9;
      if ((pMVar13->vPages).nSize <= (int)(uVar15 >> 0xc)) goto LAB_0047b8d8;
      pvVar3 = (pMVar13->vPages).pArray[uVar15 >> 0xc];
      if (pvVar3 == (void *)0x0) break;
      pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      uVar15 = *(uint *)((long)pvVar3 + (ulong)((uVar15 & 0xfff) << 4) + 0xc);
      if (((int)uVar15 < 0) || (uVar15 = uVar15 & 0xfffffffe, iVar7 <= (int)uVar15))
      goto LAB_0047b935;
      local_98[uVar15] = pAVar11->Id;
      lVar18 = lVar18 + 1;
      pMVar13 = p->pMig;
      uVar16 = (ulong)(pMVar13->vCis).nSize;
    } while (lVar18 < (long)uVar16);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  pMVar13 = p->pMig;
  uVar15 = (pMVar13->vCos).nSize;
  lVar18 = (long)(int)uVar15;
  if (0 < lVar18) {
    lVar19 = 0;
    do {
      if (lVar18 == lVar19) goto LAB_0047b8f7;
      uVar9 = (pMVar13->vCos).pArray[lVar19];
      if (((int)uVar9 < 0) || (pMVar13->nObjs <= (int)uVar9)) goto LAB_0047b8b9;
      if ((pMVar13->vPages).nSize <= (int)(uVar9 >> 0xc)) goto LAB_0047b8d8;
      pvVar3 = (pMVar13->vPages).pArray[uVar9 >> 0xc];
      if (pvVar3 == (void *)0x0) break;
      if (*(int *)((long)pvVar3 + (ulong)((uVar9 & 0xfff) << 4)) == 0) {
        pAVar11 = Abc_NtkCreateNodeConst0(pNtk);
        if (iVar1 < 1) goto LAB_0047b935;
        *local_98 = pAVar11->Id;
        pMVar13 = p->pMig;
        uVar15 = (pMVar13->vCos).nSize;
        break;
      }
      lVar19 = lVar19 + 1;
    } while (lVar18 != lVar19);
    if (0 < (int)uVar15) {
      uVar16 = 0;
      do {
        if (uVar15 == uVar16) goto LAB_0047b8f7;
        uVar9 = (pMVar13->vCos).pArray[uVar16];
        if (((int)uVar9 < 0) || (pMVar13->nObjs <= (int)uVar9)) goto LAB_0047b8b9;
        if ((pMVar13->vPages).nSize <= (int)(uVar9 >> 0xc)) goto LAB_0047b8d8;
        pvVar3 = (pMVar13->vPages).pArray[uVar9 >> 0xc];
        if (pvVar3 == (void *)0x0) break;
        if (*(int *)((long)pvVar3 + (ulong)((uVar9 & 0xfff) << 4)) == 1) {
          pAVar11 = Abc_NtkCreateNodeConst1(pNtk);
          if (iVar1 < 1) goto LAB_0047b935;
          local_98[1] = pAVar11->Id;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
  }
  iVar1 = __ptr_00->nSize;
  if (0 < (long)iVar1) {
    piVar4 = __ptr_00->pArray;
    lVar18 = 0;
    do {
      uVar15 = piVar4[lVar18];
      if (((int)uVar15 < 0) || (pMVar13 = p->pMig, pMVar13->nObjs <= (int)uVar15))
      goto LAB_0047b8b9;
      if ((pMVar13->vPages).nSize <= (int)(uVar15 >> 0xc)) goto LAB_0047b8d8;
      uVar9 = *(uint *)((long)(pMVar13->vPages).pArray[uVar15 >> 0xc] +
                       (ulong)((uVar15 & 0xfff) << 4) + 0xc) >> 1;
      if ((p->vCutBests).nSize <= (int)uVar9) goto LAB_0047b8f7;
      uVar9 = (p->vCutBests).pArray[uVar9];
      pMVar5 = p->pManCuts;
      uVar17 = pMVar5->uMask & uVar9;
      if ((int)uVar17 < 1) {
        __assert_fail("(h & p->uMask) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
      }
      uVar9 = (int)uVar9 >> ((byte)pMVar5->nBits & 0x1f);
      if ((int)uVar9 < 1) {
LAB_0047b916:
        __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                      ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
      }
      iVar8 = *(int *)((long)pMVar5 + (ulong)uVar17 * 0x38 + 0x34);
      bVar14 = (byte)*(undefined4 *)((long)pMVar5 + (ulong)uVar17 * 0x38 + 0x18);
      if (iVar8 << (bVar14 & 0x1f) <= (int)uVar9) goto LAB_0047b916;
      uVar21 = uVar9 >> (bVar14 & 0x1f);
      if (iVar8 <= (int)uVar21) goto LAB_0047b8d8;
      lVar19 = *(long *)(*(long *)((long)pMVar5 + (ulong)uVar17 * 0x38 + 0x38) + (ulong)uVar21 * 8);
      uVar16 = (ulong)(uVar9 & *(uint *)((long)pMVar5 + (ulong)uVar17 * 0x38 + 0x1c));
      uVar9 = *(uint *)(lVar19 + 4 + uVar16 * 8);
      if ((uVar9 >> 0x19) + 0xc >> 3 != uVar17) {
        __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                      ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
      }
      uVar9 = uVar9 >> 1 & 0xffffff;
      if (p->vNpnConfigs->nSize <= (int)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = p->vNpnConfigs->pArray;
      uVar20 = (ulong)(uVar9 << 4);
      if (*(int *)((long)&pVVar6->nSize + uVar20) < 1) goto LAB_0047b8f7;
      lVar19 = lVar19 + uVar16 * 8;
      uVar9 = **(uint **)((long)&pVVar6->pArray + uVar20);
      pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      uVar17 = *(uint *)(lVar19 + 4) >> 1 & 0xffffff;
      if (__ptr->nSize <= (int)uVar17) goto LAB_0047b8d8;
      pvVar3 = __ptr->pArray[uVar17];
      (pAVar11->field_5).pData = pvVar3;
      if (pvVar3 == (void *)0x0) {
        __assert_fail("pObj->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                      ,0xe0,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
      }
      uVar17 = *(uint *)(lVar19 + 4);
      if (0x7ffffff < uVar17) {
        uVar21 = uVar9 & 0xffff;
        if (0xb3ff < uVar21) {
          __assert_fail("(Config >> 6) < 720",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                        ,0xe5,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
        }
        uVar16 = 0;
        do {
          uVar2 = *(uint *)(lVar19 + 8 + (long)p->Perm6[uVar21 >> 6][uVar16] * 4);
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pAVar12 = Mpm_ManGetAbcNode(pNtk,vCopy,uVar2 ^ (uVar21 >> ((uint)uVar16 & 0x1f) & 1) != 0)
          ;
          Abc_ObjAddFanin(pAVar11,pAVar12);
          uVar16 = uVar16 + 1;
        } while (uVar16 < *(uint *)(lVar19 + 4) >> 0x1b);
      }
      uVar15 = ((uVar17 >> 0x19 ^ uVar17 ^ uVar9 >> 0x10) & 1) + uVar15 * 2;
      if (iVar7 <= (int)uVar15) {
LAB_0047b935:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      local_98[uVar15] = pAVar11->Id;
      lVar18 = lVar18 + 1;
    } while (lVar18 != iVar1);
  }
  pMVar13 = p->pMig;
  uVar15 = (pMVar13->vCos).nSize;
  uVar16 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    lVar18 = 0;
    do {
      if ((int)uVar16 <= lVar18) {
LAB_0047b8f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar15 = (pMVar13->vCos).pArray[lVar18];
      if (((int)uVar15 < 0) || (pMVar13->nObjs <= (int)uVar15)) {
LAB_0047b8b9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                      ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
      }
      if ((pMVar13->vPages).nSize <= (int)(uVar15 >> 0xc)) {
LAB_0047b8d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = (pMVar13->vPages).pArray[uVar15 >> 0xc];
      if (pvVar3 == (void *)0x0) break;
      pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      pAVar12 = Mpm_ManGetAbcNode(pNtk,vCopy,*(int *)((long)pvVar3 + (ulong)((uVar15 & 0xfff) << 4))
                                 );
      Abc_ObjAddFanin(pAVar11,pAVar12);
      lVar18 = lVar18 + 1;
      pMVar13 = p->pMig;
      uVar16 = (ulong)(pMVar13->vCos).nSize;
    } while (lVar18 < (long)uVar16);
  }
  Abc_NtkAddDummyPoNames(pNtk);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (local_98 != (int *)0x0) {
    free(local_98);
  }
  free(vCopy);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk( Mpm_Man_t * p, Mio_Library_t * pMio )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vNodes, * vCopy, * vClass;
    Abc_Obj_t * pObj, * pFanin;
    Mig_Obj_t * pNode;
    Mpm_Cut_t * pCutBest;
    int i, k, iNode, iMigLit, fCompl, Config;

    // find mapping of SCL cells into MIO cells
    vNpnGatesMio = Mpm_ManFindCells( pMio, (SC_Lib *)p->pPars->pScl, p->vNpnConfigs );
    if ( vNpnGatesMio == NULL )
    {
        printf( "Genlib library does not match SCL library.\n" );
        return NULL;
    }

    // create mapping for each phase of each node
    vCopy = Vec_IntStartFull( 2 * Mig_ManObjNum(p->pMig) );

    // get internal nodes
    vNodes = Mpm_ManFindMappedNodes( p );

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_MAP, 1 );
    pNtk->pName = Extra_UtilStrsav( p->pMig->pName );
    pNtk->pManFunc = pMio;

    // create primary inputs
    Mig_ManForEachCi( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePi(pNtk);
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit( Mig_ObjId(pNode), 0 ), Abc_ObjId(pObj) );
    }
    Abc_NtkAddDummyPiNames( pNtk );

    // create constant nodes
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 0 )
        {
            pObj = Abc_NtkCreateNodeConst0(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 0 ), Abc_ObjId(pObj) );
            break;
        }
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 1 )
        {
            pObj = Abc_NtkCreateNodeConst1(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 1 ), Abc_ObjId(pObj) );
            break;
        }

    // create internal nodes
    Vec_IntForEachEntry( vNodes, iNode, i )
    {
        pCutBest = Mpm_ObjCutBestP( p, Mig_ManObj(p->pMig, iNode) );
        vClass = Vec_WecEntry( p->vNpnConfigs, Abc_Lit2Var(pCutBest->iFunc) );
        Config = Vec_IntEntry( vClass, 0 );
        pObj = Abc_NtkCreateNode( pNtk );
        pObj->pData = Vec_PtrEntry( vNpnGatesMio, Abc_Lit2Var(pCutBest->iFunc) );
        assert( pObj->pData != NULL );
        fCompl = pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) ^ ((Config >> 16) & 1);
        Config &= 0xFFFF;
        for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
        {
            assert( (Config >> 6) < 720 );
            iMigLit = pCutBest->pLeaves[ (int)(p->Perm6[Config >> 6][k]) ];
            pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Abc_LitNotCond(iMigLit, (Config >> k) & 1) );
            Abc_ObjAddFanin( pObj, pFanin );
        }
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit(iNode, fCompl), Abc_ObjId(pObj) );
    }

    // create primary outputs
    Mig_ManForEachCo( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePo(pNtk);
        pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Mig_ObjFaninLit(pNode, 0) );
        Abc_ObjAddFanin( pObj, pFanin );
    }
    Abc_NtkAddDummyPoNames( pNtk );

    // clean up
    Vec_PtrFree( vNpnGatesMio );
    Vec_IntFree( vNodes );
    Vec_IntFree( vCopy );
    return pNtk;
}